

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O3

Value * __thiscall
wabt::Decompiler::WrapBinary
          (Value *__return_storage_ptr__,Decompiler *this,
          vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> *args,
          string_view infix,bool indent_right,Precedence precedence)

{
  Value *val;
  pointer pbVar1;
  pointer pbVar2;
  size_t sVar3;
  pointer pbVar4;
  ulong uVar5;
  pointer pbVar6;
  char *pcVar7;
  pointer pbVar8;
  undefined4 uVar9;
  undefined7 in_register_00000089;
  long lVar10;
  ulong uVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  undefined4 in_stack_ffffffffffffff68;
  char cVar12;
  size_t local_78;
  char *local_70;
  string local_68;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  pcVar7 = infix._M_str;
  sVar3 = infix._M_len;
  uVar9 = (undefined4)CONCAT71(in_register_00000089,indent_right);
  val = (args->super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
        )._M_impl.super__Vector_impl_data._M_start;
  local_78 = sVar3;
  local_70 = pcVar7;
  if ((long)(args->
            super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>).
            _M_impl.super__Vector_impl_data._M_finish - (long)val == 0x40) {
    BracketIfNeeded(this,val,precedence);
    BracketIfNeeded(this,val + 1,precedence);
    pbVar1 = (val->v).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar11 = 0;
    pbVar6 = (val->v).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (pbVar4 = pbVar6; pbVar4 != pbVar1; pbVar4 = pbVar4 + 1) {
      if (uVar11 <= pbVar4->_M_string_length) {
        uVar11 = pbVar4->_M_string_length;
      }
    }
    pbVar2 = val[1].v.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar5 = 0;
    pbVar4 = val[1].v.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (pbVar8 = pbVar4; pbVar8 != pbVar2; pbVar8 = pbVar8 + 1) {
      if (uVar5 <= pbVar8->_M_string_length) {
        uVar5 = pbVar8->_M_string_length;
      }
    }
    if ((((long)pbVar2 - (long)pbVar4 == 0x20) && ((long)pbVar1 - (long)pbVar6 == 0x20)) &&
       (uVar11 + sVar3 + uVar5 + 2 < this->target_exp_width)) {
      cat<std::__cxx11::string,char[2],std::basic_string_view<char,std::char_traits<char>>,char[2],std::__cxx11::string>
                (&local_68,(wabt *)pbVar6,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x157e4b,
                 (char (*) [2])&local_78,
                 (basic_string_view<char,_std::char_traits<char>_> *)0x157e4b,(char (*) [2])pbVar4,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uVar9,in_stack_ffffffffffffff68));
      local_48 = 0;
      uStack_40 = 0;
      local_38 = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
                 &local_68,&local_48);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&__return_storage_ptr__->v,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_48);
      __return_storage_ptr__->precedence = precedence;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      local_68._M_dataplus._M_p = (pointer)0x0;
      local_68._M_string_length = 0;
      local_68.field_2._M_allocated_capacity = 0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&__return_storage_ptr__->v,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_68);
      __return_storage_ptr__->precedence = precedence;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_68);
      cVar12 = (char)uVar9;
      pbVar6 = (val->v).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar10 = (long)(val->v).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar6 >> 5;
      if (0 < lVar10) {
        uVar11 = lVar10 + 1;
        do {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     __return_storage_ptr__,pbVar6);
          cVar12 = (char)uVar9;
          pbVar6 = pbVar6 + 1;
          uVar11 = uVar11 - 1;
        } while (1 < uVar11);
      }
      std::__cxx11::string::append
                ((char *)((__return_storage_ptr__->v).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish + -1),0x157e4b);
      std::__cxx11::string::append
                ((char *)((__return_storage_ptr__->v).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish + -1),(ulong)pcVar7);
      if (cVar12 != '\0') {
        IndentValue(this,val + 1,this->indent_amount,(string_view)ZEXT816(0));
      }
      pbVar6 = val[1].v.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar10 = (long)val[1].v.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar6 >> 5;
      if (0 < lVar10) {
        uVar11 = lVar10 + 1;
        do {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     __return_storage_ptr__,pbVar6);
          pbVar6 = pbVar6 + 1;
          uVar11 = uVar11 - 1;
        } while (1 < uVar11);
      }
    }
    return __return_storage_ptr__;
  }
  __assert_fail("args.size() == 2",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/decompiler.cc"
                ,0x96,
                "Value wabt::Decompiler::WrapBinary(std::vector<Value> &, std::string_view, bool, Precedence)"
               );
}

Assistant:

Value WrapBinary(std::vector<Value>& args,
                   std::string_view infix,
                   bool indent_right,
                   Precedence precedence) {
    assert(args.size() == 2);
    auto& left = args[0];
    auto& right = args[1];
    BracketIfNeeded(left, precedence);
    BracketIfNeeded(right, precedence);
    auto width = infix.size() + left.width() + right.width() + 2;
    if (width < target_exp_width && left.v.size() == 1 && right.v.size() == 1) {
      return Value{{cat(left.v[0], " ", infix, " ", right.v[0])}, precedence};
    } else {
      Value bin{{}, precedence};
      std::move(left.v.begin(), left.v.end(), std::back_inserter(bin.v));
      bin.v.back().append(" ", 1);
      bin.v.back().append(infix.data(), infix.size());
      if (indent_right) {
        IndentValue(right, indent_amount, {});
      }
      std::move(right.v.begin(), right.v.end(), std::back_inserter(bin.v));
      return bin;
    }
  }